

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereSphereCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btSphereSphereCollisionAlgorithm::processCollision
          (btSphereSphereCollisionAlgorithm *this,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btCollisionShape *pbVar3;
  btCollisionShape *pbVar4;
  btPersistentManifold *pbVar5;
  btCollisionObject *pbVar6;
  btCollisionObject *pbVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector3 pos1;
  
  if (this->m_manifoldPtr != (btPersistentManifold *)0x0) {
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pbVar3 = col0Wrap->m_shape;
    pbVar4 = col1Wrap->m_shape;
    uVar1 = *(undefined8 *)(col0Wrap->m_worldTransform->m_origin).m_floats;
    uVar2 = *(undefined8 *)(col1Wrap->m_worldTransform->m_origin).m_floats;
    fVar9 = (float)uVar1 - (float)uVar2;
    fVar10 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
    fVar11 = (col0Wrap->m_worldTransform->m_origin).m_floats[2] -
             (col1Wrap->m_worldTransform->m_origin).m_floats[2];
    fVar9 = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
      uVar8 = extraout_XMM0_Db;
    }
    else {
      uVar8 = 0;
      fVar9 = SQRT(fVar9);
    }
    fVar10 = *(float *)&pbVar3[1].field_0xc * *(float *)&pbVar3->field_0x1c +
             *(float *)&pbVar4[1].field_0xc * *(float *)&pbVar4->field_0x1c;
    if (fVar9 <= fVar10) {
      (*(resultOut->super_Result)._vptr_Result[4])(CONCAT44(uVar8,fVar9 - fVar10),resultOut);
      pbVar5 = resultOut->m_manifoldPtr;
      if (pbVar5->m_cachedPoints != 0) {
        pbVar7 = resultOut->m_body0Wrap->m_collisionObject;
        if (pbVar5->m_body0 == pbVar7) {
          pbVar6 = resultOut->m_body1Wrap->m_collisionObject;
        }
        else {
          pbVar6 = pbVar7;
          pbVar7 = resultOut->m_body1Wrap->m_collisionObject;
        }
        btPersistentManifold::refreshContactPoints
                  (pbVar5,&pbVar7->m_worldTransform,&pbVar6->m_worldTransform);
      }
    }
    else {
      pbVar5 = resultOut->m_manifoldPtr;
      if (pbVar5->m_cachedPoints != 0) {
        pbVar7 = resultOut->m_body0Wrap->m_collisionObject;
        if (pbVar5->m_body0 == pbVar7) {
          pbVar6 = resultOut->m_body1Wrap->m_collisionObject;
        }
        else {
          pbVar6 = pbVar7;
          pbVar7 = resultOut->m_body1Wrap->m_collisionObject;
        }
        btPersistentManifold::refreshContactPoints
                  (pbVar5,&pbVar7->m_worldTransform,&pbVar6->m_worldTransform);
        return;
      }
    }
  }
  return;
}

Assistant:

void btSphereSphereCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)dispatchInfo;

	if (!m_manifoldPtr)
		return;

	resultOut->setPersistentManifold(m_manifoldPtr);

	btSphereShape* sphere0 = (btSphereShape*)col0Wrap->getCollisionShape();
	btSphereShape* sphere1 = (btSphereShape*)col1Wrap->getCollisionShape();

	btVector3 diff = col0Wrap->getWorldTransform().getOrigin()-  col1Wrap->getWorldTransform().getOrigin();
	btScalar len = diff.length();
	btScalar radius0 = sphere0->getRadius();
	btScalar radius1 = sphere1->getRadius();

#ifdef CLEAR_MANIFOLD
	m_manifoldPtr->clearManifold(); //don't do this, it disables warmstarting
#endif

	///iff distance positive, don't generate a new contact
	if ( len > (radius0+radius1))
	{
#ifndef CLEAR_MANIFOLD
		resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD
		return;
	}
	///distance (negative means penetration)
	btScalar dist = len - (radius0+radius1);

	btVector3 normalOnSurfaceB(1,0,0);
	if (len > SIMD_EPSILON)
	{
		normalOnSurfaceB = diff / len;
	}

	///point on A (worldspace)
	///btVector3 pos0 = col0->getWorldTransform().getOrigin() - radius0 * normalOnSurfaceB;
	///point on B (worldspace)
	btVector3 pos1 = col1Wrap->getWorldTransform().getOrigin() + radius1* normalOnSurfaceB;

	/// report a contact. internally this will be kept persistent, and contact reduction is done
	
	
	resultOut->addContactPoint(normalOnSurfaceB,pos1,dist);

#ifndef CLEAR_MANIFOLD
	resultOut->refreshContactPoints();
#endif //CLEAR_MANIFOLD

}